

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bias_x86.cpp
# Opt level: O0

int __thiscall ncnn::Bias_x86::forward_inplace(Bias_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long *in_RSI;
  long in_RDI;
  __m128 _outp;
  __m128 _p;
  __m128 _bias;
  int i;
  float bias;
  float *ptr;
  int q;
  float *bias_ptr;
  int size;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  int local_1cc;
  float *local_170;
  int local_164;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  
  lVar3 = in_RSI[7];
  iVar4 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6] * *(int *)((long)in_RSI + 0x34);
  lVar2 = *(long *)(in_RDI + 0xd8);
  for (local_164 = 0; local_164 < (int)lVar3; local_164 = local_164 + 1) {
    local_170 = (float *)(*in_RSI + in_RSI[8] * (long)local_164 * in_RSI[2]);
    fVar1 = *(float *)(lVar2 + (long)local_164 * 4);
    for (local_1cc = 0; local_1cc + 3 < iVar4; local_1cc = local_1cc + 4) {
      local_b8 = (float)*(undefined8 *)local_170;
      fStack_b4 = (float)((ulong)*(undefined8 *)local_170 >> 0x20);
      fStack_b0 = (float)*(undefined8 *)(local_170 + 2);
      fStack_ac = (float)((ulong)*(undefined8 *)(local_170 + 2) >> 0x20);
      *(ulong *)local_170 = CONCAT44(fStack_b4 + fVar1,local_b8 + fVar1);
      *(ulong *)(local_170 + 2) = CONCAT44(fStack_ac + fVar1,fStack_b0 + fVar1);
      local_170 = local_170 + 4;
    }
    for (; local_1cc < iVar4; local_1cc = local_1cc + 1) {
      *local_170 = *local_170 + fVar1;
      local_170 = local_170 + 1;
    }
  }
  return 0;
}

Assistant:

int Bias_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int size = w * h * d;

    const float* bias_ptr = bias_data;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float bias = bias_ptr[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        {
            __m256 _bias256 = _mm256_set1_ps(bias);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _outp = _mm256_add_ps(_p, _bias256);
                _mm256_storeu_ps(ptr, _outp);

                ptr += 8;
            }
        }
#endif // __AVX__
        {
            __m128 _bias = _mm_set1_ps(bias);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _outp = _mm_add_ps(_p, _bias);
                _mm_storeu_ps(ptr, _outp);

                ptr += 4;
            }
        }
#endif // __SSE2__

        for (; i < size; i++)
        {
            *ptr = *ptr + bias;

            ptr++;
        }
    }

    return 0;
}